

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O0

string * __thiscall cfd::core::CfdException::GetErrorType_abi_cxx11_(CfdException *this)

{
  initializer_list<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  mapped_type *pmVar2;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  undefined1 ***in_stack_fffffffffffffdf8;
  map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe00;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator_type *in_stack_fffffffffffffe20;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  key_type *local_1b0 [50];
  undefined1 **local_20;
  undefined8 local_18;
  
  this_00 = in_RDI;
  if (GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[22],_true>
                (this_00,&in_RDI->first,(char (*) [22])in_stack_fffffffffffffe00);
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (this_00,&in_RDI->first,(char (*) [14])in_stack_fffffffffffffe00);
      uVar10 = 0xfffffffe;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[15],_true>
                (this_00,&in_RDI->first,(char (*) [15])in_stack_fffffffffffffe00);
      uVar9 = 0xfffffffd;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[12],_true>
                (this_00,&in_RDI->first,(char (*) [12])in_stack_fffffffffffffe00);
      uVar8 = 1;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (this_00,&in_RDI->first,(char (*) [17])in_stack_fffffffffffffe00);
      uVar7 = 2;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (this_00,&in_RDI->first,(char (*) [14])in_stack_fffffffffffffe00);
      uVar6 = 3;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[13],_true>
                (this_00,&in_RDI->first,(char (*) [13])in_stack_fffffffffffffe00);
      uVar5 = 4;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[16],_true>
                (this_00,&in_RDI->first,(char (*) [16])in_stack_fffffffffffffe00);
      uVar4 = 5;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (this_00,&in_RDI->first,(char (*) [17])in_stack_fffffffffffffe00);
      uVar3 = 6;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[18],_true>
                (this_00,&in_RDI->first,(char (*) [18])in_stack_fffffffffffffe00);
      local_20 = (undefined1 **)local_1b0;
      local_18 = 10;
      in_stack_fffffffffffffe00 =
           (map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&stack0xfffffffffffffe26;
      ::std::
      allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x2b3306);
      __l._M_array._4_4_ = uVar8;
      __l._M_array._0_4_ = uVar7;
      __l._M_len._0_4_ = uVar9;
      __l._M_len._4_4_ = uVar10;
      ::std::
      map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT44(uVar6,uVar5),__l,(less<cfd::core::CfdError> *)CONCAT44(uVar4,uVar3),
            in_stack_fffffffffffffe20);
      ::std::
      allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x2b3338);
      in_stack_fffffffffffffdf8 = &local_20;
      do {
        in_stack_fffffffffffffdf8 = in_stack_fffffffffffffdf8 + -5;
        ::std::
        pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2b3360);
      } while (in_stack_fffffffffffffdf8 != (undefined1 ***)local_1b0);
      __cxa_atexit(::std::
                   map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    }
  }
  pmVar2 = ::std::
           map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
  ::std::__cxx11::string::string((string *)in_RDI,(string *)pmVar2);
  return (string *)this_00;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN
      _GLIBCXX_USE_NOEXCEPT {
    static const std::map<CfdError, std::string> kErrorTypeMap(
        {{kCfdSuccess, "successful_completion"},
         {kCfdUnknownError, "unknown_error"},
         {kCfdInternalError, "internal_error"},
         {kCfdMemoryFullError, "memory_full"},
         {kCfdIllegalArgumentError, "illegal_argument"},
         {kCfdIllegalStateError, "illegal_state"},
         {kCfdOutOfRangeError, "out_of_range"},
         {kCfdInvalidSettingError, "invalid_setting"},
         {kCfdConnectionError, "connection_error"},
         {kCfdDiskAccessError, "disk_access_error"}});
    return kErrorTypeMap.at(error_code_);
  }